

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::SchnorrSignRequest::ConvertFromStruct
          (SchnorrSignRequest *this,SchnorrSignRequestStruct *data)

{
  SchnorrSignRequestStruct *data_local;
  SchnorrSignRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->privkey_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->message_,(string *)&data->message);
  this->is_hashed_ = (bool)(data->is_hashed & 1);
  std::__cxx11::string::operator=((string *)&this->nonce_or_aux_,(string *)&data->nonce_or_aux);
  this->is_nonce_ = (bool)(data->is_nonce & 1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void SchnorrSignRequest::ConvertFromStruct(
    const SchnorrSignRequestStruct& data) {
  privkey_ = data.privkey;
  message_ = data.message;
  is_hashed_ = data.is_hashed;
  nonce_or_aux_ = data.nonce_or_aux;
  is_nonce_ = data.is_nonce;
  ignore_items = data.ignore_items;
}